

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O3

void __thiscall RationalNum::simplify(RationalNum *this)

{
  longlong tempD;
  longlong tempN;
  longlong local_28;
  longlong local_20;
  
  local_20 = this->numerator;
  local_28 = this->denominator;
  simplifyFun(&local_20,&local_28);
  this->numerator = local_20;
  setDenominator(this,local_28);
  return;
}

Assistant:

void RationalNum::simplify() {
    long long int tempN = numerator;
    long long int tempD = denominator;
    simplifyFun(tempN, tempD);
    setNumerator(tempN);
    setDenominator(tempD);
}